

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::OptNonGreedy
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  EncodedChar EVar1;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_local;
  
  EVar1 = ECLookahead(this,0);
  if (EVar1 == '?') {
    ECConsume(this,1);
  }
  this_local._7_1_ = EVar1 != '?';
  return this_local._7_1_;
}

Assistant:

bool Parser<P, IsLiteral>::OptNonGreedy()
    {
        // Could be terminating 0
        if (ECLookahead() != '?')
            return true;
        ECConsume();
        return false;
    }